

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O0

int ini_find_section(ini_t *ini,char *name,int name_length)

{
  int iVar1;
  ini_internal_section_t *local_38;
  char *other;
  int i;
  int name_length_local;
  char *name_local;
  ini_t *ini_local;
  
  if ((ini != (ini_t *)0x0) && (name != (char *)0x0)) {
    other._4_4_ = name_length;
    if (name_length < 1) {
      other._4_4_ = sx_strlen(name);
    }
    for (other._0_4_ = 0; (int)other < ini->section_count; other._0_4_ = (int)other + 1) {
      if (ini->sections[(int)other].name_large == (char *)0x0) {
        local_38 = ini->sections + (int)other;
      }
      else {
        local_38 = (ini_internal_section_t *)ini->sections[(int)other].name_large;
      }
      iVar1 = strncasecmp(name,local_38->name,(long)other._4_4_);
      if (iVar1 == 0) {
        return (int)other;
      }
    }
  }
  return -1;
}

Assistant:

int ini_find_section( ini_t const* ini, char const* name, int name_length )
    {
    int i;

    if( ini && name )
        {
        if( name_length <= 0 ) name_length = (int) INI_STRLEN( name );
        for( i = 0; i < ini->section_count; ++i )
            {
            char const* const other = 
                ini->sections[ i ].name_large ? ini->sections[ i ].name_large : ini->sections[ i ].name;
            if( INI_STRNICMP( name, other, name_length ) == 0 )
                return i;
            }
        }

    return INI_NOT_FOUND;
    }